

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ObjectivePropagation::getPropagationConstraint
          (ObjectivePropagation *this,HighsInt domchgStackSize,double **vals,HighsInt **inds,
          HighsInt *len,double *rhs,HighsInt domchgCol)

{
  HighsDomain *pHVar1;
  int *piVar2;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar3;
  double *pdVar4;
  pointer pHVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<double,_std::allocator<double>_> *this_01;
  const_reference pvVar8;
  reference pvVar9;
  long *in_RCX;
  undefined8 *in_RDX;
  long in_RDI;
  undefined4 *in_R8;
  double *in_R9;
  double dVar10;
  int in_stack_00000008;
  HighsInt j_1;
  vector<double,_std::allocator<double>_> *packedObjVals;
  double ub;
  double lb;
  HighsInt pos;
  HighsInt c;
  HighsInt j;
  double largest;
  HighsInt end;
  HighsInt start;
  HighsInt i;
  HighsCDouble tmpRhs;
  vector<int,_std::allocator<int>_> *partitionStarts;
  HighsInt numPartitions;
  value_type in_stack_ffffffffffffff38;
  HighsCDouble *in_stack_ffffffffffffff40;
  HighsDomain *in_stack_ffffffffffffff48;
  HighsInt col;
  HighsDomain *in_stack_ffffffffffffff50;
  value_type local_9c;
  double local_90;
  double local_88;
  double local_80;
  int local_70;
  value_type local_6c;
  HighsDomain *local_68;
  int local_5c;
  value_type local_58;
  int local_54;
  HighsCDouble local_50;
  vector<int,_std::allocator<int>_> *local_40;
  HighsInt local_34;
  double *local_30;
  undefined4 *local_28;
  long *local_20;
  undefined8 *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_34 = HighsObjectiveFunction::getNumCliquePartitions((HighsObjectiveFunction *)0x5bf103);
  HighsObjectiveFunction::getObjectiveNonzeros(*(HighsObjectiveFunction **)(in_RDI + 8));
  piVar2 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x5bf122);
  *local_20 = (long)piVar2;
  this_00 = HighsObjectiveFunction::getObjectiveNonzeros(*(HighsObjectiveFunction **)(in_RDI + 8));
  sVar3 = std::vector<int,_std::allocator<int>_>::size(this_00);
  *local_28 = (int)sVar3;
  if (local_34 == 0) {
    HighsObjectiveFunction::getObjectiveValuesPacked(*(HighsObjectiveFunction **)(in_RDI + 8));
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x5bf172);
    *local_18 = pdVar4;
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5bf19b);
    *local_30 = pHVar5->upper_limit;
  }
  else {
    local_40 = HighsObjectiveFunction::getCliquePartitionStarts
                         (*(HighsObjectiveFunction **)(in_RDI + 8));
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5bf1e8);
    HighsCDouble::HighsCDouble(&local_50,pHVar5->upper_limit);
    for (local_54 = 0; local_54 < local_34; local_54 = local_54 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_40,(long)local_54);
      local_58 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_40,(long)(local_54 + 1));
      local_5c = *pvVar6;
      local_68 = (HighsDomain *)0x0;
      for (local_6c = local_58; local_6c < local_5c; local_6c = local_6c + 1) {
        local_70 = *(int *)(*local_20 + (long)local_6c * 4);
        if (local_70 != in_stack_00000008) {
          col = (HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20);
          if (*(double *)(*(long *)(in_RDI + 0x10) + (long)local_70 * 8) <= 0.0) {
            local_88 = getColUpperPos(in_stack_ffffffffffffff50,col,
                                      (HighsInt)in_stack_ffffffffffffff48,
                                      (HighsInt *)in_stack_ffffffffffffff40);
            if (0.0 < local_88) {
              local_90 = -*(double *)(*(long *)(in_RDI + 0x10) + (long)local_70 * 8);
              pdVar4 = std::max<double>((double *)&local_68,&local_90);
              local_68 = (HighsDomain *)*pdVar4;
            }
          }
          else {
            local_80 = getColLowerPos(in_stack_ffffffffffffff50,col,
                                      (HighsInt)in_stack_ffffffffffffff48,
                                      (HighsInt *)in_stack_ffffffffffffff40);
            if (local_80 < 1.0) {
              pdVar4 = std::max<double>((double *)&local_68,
                                        (double *)(*(long *)(in_RDI + 0x10) + (long)local_70 * 8));
              local_68 = (HighsDomain *)*pdVar4;
            }
          }
        }
      }
      in_stack_ffffffffffffff50 = local_68;
      std::
      vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
      ::operator[]((vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                    *)(in_RDI + 0x88),(long)local_54);
      HighsCDouble::operator+=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      pvVar7 = std::
               vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
               ::operator[]((vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                             *)(in_RDI + 0x88),(long)local_54);
      if ((pvVar7->multiplier != (double)local_68) ||
         (NAN(pvVar7->multiplier) || NAN((double)local_68))) {
        in_stack_ffffffffffffff48 = local_68;
        pvVar7 = std::
                 vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                 ::operator[]((vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                               *)(in_RDI + 0x88),(long)local_54);
        pvVar7->multiplier = (double)in_stack_ffffffffffffff48;
        this_01 = HighsObjectiveFunction::getObjectiveValuesPacked
                            (*(HighsObjectiveFunction **)(in_RDI + 8));
        for (local_9c = local_58; local_9c < local_5c; local_9c = local_9c + 1) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_9c);
          pHVar1 = local_68;
          in_stack_ffffffffffffff38 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_9c);
          in_stack_ffffffffffffff40 =
               (HighsCDouble *)
               (in_stack_ffffffffffffff38 -
               (double)((ulong)pHVar1 & 0x7fffffffffffffff | (ulong)*pvVar8 & 0x8000000000000000));
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                              (long)local_9c);
          *pvVar9 = (value_type)in_stack_ffffffffffffff40;
        }
      }
    }
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x5bf536);
    *local_18 = pdVar4;
    dVar10 = HighsCDouble::operator_cast_to_double(&local_50);
    *local_30 = dVar10;
  }
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::getPropagationConstraint(
    HighsInt domchgStackSize, const double*& vals, const HighsInt*& inds,
    HighsInt& len, double& rhs, HighsInt domchgCol) {
  const HighsInt numPartitions = objFunc->getNumCliquePartitions();
  inds = objFunc->getObjectiveNonzeros().data();
  len = objFunc->getObjectiveNonzeros().size();
  if (numPartitions == 0) {
    vals = objFunc->getObjectiveValuesPacked().data();
    rhs = domain->mipsolver->mipdata_->upper_limit;
    return;
  }
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();

  HighsCDouble tmpRhs = domain->mipsolver->mipdata_->upper_limit;
  for (HighsInt i = 0; i < numPartitions; ++i) {
    HighsInt start = partitionStarts[i];
    HighsInt end = partitionStarts[i + 1];
    double largest = 0.0;
    for (HighsInt j = start; j < end; ++j) {
      HighsInt c = inds[j];
      HighsInt pos;
      // skip the column we might want to explain a bound change for and take
      // the second largest column instead.
      if (c == domchgCol) continue;
      if (cost[c] > 0) {
        double lb = domain->getColLowerPos(c, domchgStackSize, pos);
        if (lb < 1) largest = std::max(largest, cost[c]);
      } else {
        double ub = domain->getColUpperPos(c, domchgStackSize, pos);
        if (ub > 0) largest = std::max(largest, -cost[c]);
      }
    }

    tmpRhs += largest * partitionCliqueData[i].rhs;
    if (partitionCliqueData[i].multiplier != largest) {
      partitionCliqueData[i].multiplier = largest;
      const auto& packedObjVals = objFunc->getObjectiveValuesPacked();
      for (HighsInt j = start; j < end; ++j)
        propagationConsBuffer[j] =
            packedObjVals[j] - std::copysign(largest, packedObjVals[j]);
    }
  }

  vals = propagationConsBuffer.data();
  rhs = double(tmpRhs);
}